

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::
~ExpressionStackWalker
          (ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_> *this)

{
  ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_> *this_local;
  
  SmallVector<wasm::Expression_*,_10UL>::~SmallVector(&this->expressionStack);
  PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::~PostWalker
            (&this->super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>);
  return;
}

Assistant:

ExpressionStackWalker() = default;